

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

TemplateCache * __thiscall
ctemplate::TemplateCache::FindTemplateFilename(TemplateCache *this,string *unresolved)

{
  bool bVar1;
  string *in_RDX;
  undefined1 local_c8 [8];
  FileStat statbuf;
  string *unresolved_local;
  TemplateCache *this_local;
  string *resolved;
  
  statbuf.internal_statbuf.__glibc_reserved[2]._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  bVar1 = ResolveTemplateFilename
                    ((TemplateCache *)unresolved,in_RDX,(string *)this,(FileStat *)local_c8);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  return this;
}

Assistant:

string TemplateCache::FindTemplateFilename(const string& unresolved)
    const {
  string resolved;
  FileStat statbuf;
  if (!ResolveTemplateFilename(unresolved, &resolved, &statbuf))
    resolved.clear();
  return resolved;
}